

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteConBounds
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this)

{
  ConBndWriter cbw;
  ConBndWriter local_18;
  
  if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons != 0) {
    BinaryFormatter::apr(&this->super_FormatterType,&this->nm,"r\t#%d ranges (rhs\'s)\n");
    local_18.nWrt_ = 0;
    local_18.nlw_ = this;
    NLFeeder_Easy::
    FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ConBndWriter>
              (this->feeder_,&local_18);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteConBounds() {
  if (Hdr().num_algebraic_cons) {
		apr(nm, "r\t#%d ranges (rhs's)\n",  // and complementarity
        (int)Hdr().num_algebraic_cons);
    ConBndWriter cbw(*this);
    Feeder().FeedConBounds(cbw);
    assert((int)Hdr().num_algebraic_cons == cbw.GetNWritten());
  }
}